

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-keyconv-ossl.cpp
# Opt level: O3

int save_rsa_pkcs8(char *out_path,char *file_pin,key_material_t *pkey)

{
  int iVar1;
  RSA *key;
  BIGNUM *pBVar2;
  BIGNUM *pBVar3;
  BIGNUM *pBVar4;
  BIGNUM *pBVar5;
  BIGNUM *pBVar6;
  BIGNUM *pBVar7;
  BIGNUM *pBVar8;
  BIGNUM *pBVar9;
  EVP_PKEY *pkey_00;
  PKCS8_PRIV_KEY_INFO *x;
  BIO *bp;
  size_t sVar10;
  X509_SIG *x_00;
  
  if (((((pkey[2].size == 0) || (pkey[3].size == 0)) || (pkey[4].size == 0)) ||
      ((pkey[5].size == 0 || (pkey[6].size == 0)))) ||
     ((pkey[7].size == 0 || ((pkey[8].size == 0 || (pkey[9].size == 0)))))) {
    save_rsa_pkcs8();
    return 1;
  }
  key = RSA_new();
  pBVar2 = BN_bin2bn((uchar *)pkey[5].big,(int)pkey[5].size,(BIGNUM *)0x0);
  pBVar3 = BN_bin2bn((uchar *)pkey[6].big,(int)pkey[6].size,(BIGNUM *)0x0);
  pBVar4 = BN_bin2bn((uchar *)pkey[4].big,(int)pkey[4].size,(BIGNUM *)0x0);
  pBVar5 = BN_bin2bn((uchar *)pkey[2].big,(int)pkey[2].size,(BIGNUM *)0x0);
  pBVar6 = BN_bin2bn((uchar *)pkey[3].big,(int)pkey[3].size,(BIGNUM *)0x0);
  pBVar7 = BN_bin2bn((uchar *)pkey[7].big,(int)pkey[7].size,(BIGNUM *)0x0);
  pBVar8 = BN_bin2bn((uchar *)pkey[8].big,(int)pkey[8].size,(BIGNUM *)0x0);
  pBVar9 = BN_bin2bn((uchar *)pkey[9].big,(int)pkey[9].size,(BIGNUM *)0x0);
  RSA_set0_factors(key,pBVar2,pBVar3);
  RSA_set0_crt_params(key,pBVar7,pBVar8,pBVar9);
  RSA_set0_key(key,pBVar5,pBVar6,pBVar4);
  pkey_00 = EVP_PKEY_new();
  iVar1 = EVP_PKEY_set1_RSA(pkey_00,key);
  if (iVar1 == 0) {
    save_rsa_pkcs8();
    return 1;
  }
  RSA_free(key);
  x = EVP_PKEY2PKCS8(pkey_00);
  if (x == (PKCS8_PRIV_KEY_INFO *)0x0) {
    save_rsa_pkcs8();
    return 1;
  }
  EVP_PKEY_free(pkey_00);
  bp = BIO_new_file(out_path,"wb");
  if (bp == (BIO *)0x0) {
    save_rsa_pkcs8();
    return 1;
  }
  if (file_pin == (char *)0x0) {
    PEM_write_bio_PKCS8_PRIV_KEY_INFO(bp,x);
  }
  else {
    sVar10 = strlen(file_pin);
    x_00 = PKCS8_encrypt(10,(EVP_CIPHER *)0x0,file_pin,(int)sVar10,(uchar *)0x0,0,0x800,x);
    if (x_00 == (X509_SIG *)0x0) {
      save_rsa_pkcs8();
      iVar1 = 1;
      goto LAB_0010329c;
    }
    PEM_write_bio_PKCS8(bp,x_00);
    X509_SIG_free(x_00);
  }
  iVar1 = 0;
  printf("The key has been written to %s\n",out_path);
LAB_0010329c:
  PKCS8_PRIV_KEY_INFO_free(x);
  BIO_free_all(bp);
  return iVar1;
}

Assistant:

int save_rsa_pkcs8(char* out_path, char* file_pin, key_material_t* pkey)
{
	RSA* rsa = NULL;
	EVP_PKEY* ossl_pkey = NULL;
	PKCS8_PRIV_KEY_INFO* p8inf = NULL;
	BIO* out = NULL;
	X509_SIG* p8 = NULL;
	int result = 0;

	// See if the key material was found.
	if
	(
		pkey[TAG_MODULUS].size <= 0 ||
		pkey[TAG_PUBEXP].size <= 0 ||
		pkey[TAG_PRIVEXP].size <= 0 ||
		pkey[TAG_PRIME1].size <= 0 ||
		pkey[TAG_PRIME2].size <= 0 ||
		pkey[TAG_EXP1].size <= 0 ||
		pkey[TAG_EXP2].size <= 0 ||
		pkey[TAG_COEFF].size <= 0
	)
	{
		fprintf(stderr, "ERROR: Some parts of the key material is missing in the input file.\n");
		return 1;
	}

	rsa = RSA_new();
	BIGNUM* bn_p =    BN_bin2bn((unsigned char*)pkey[TAG_PRIME1].big,  pkey[TAG_PRIME1].size, NULL);
	BIGNUM* bn_q =    BN_bin2bn((unsigned char*)pkey[TAG_PRIME2].big,  pkey[TAG_PRIME2].size, NULL);
	BIGNUM* bn_d =    BN_bin2bn((unsigned char*)pkey[TAG_PRIVEXP].big, pkey[TAG_PRIVEXP].size, NULL);
	BIGNUM* bn_n =    BN_bin2bn((unsigned char*)pkey[TAG_MODULUS].big, pkey[TAG_MODULUS].size, NULL);
	BIGNUM* bn_e =    BN_bin2bn((unsigned char*)pkey[TAG_PUBEXP].big,  pkey[TAG_PUBEXP].size, NULL);
	BIGNUM* bn_dmp1 = BN_bin2bn((unsigned char*)pkey[TAG_EXP1].big,    pkey[TAG_EXP1].size, NULL);
	BIGNUM* bn_dmq1 = BN_bin2bn((unsigned char*)pkey[TAG_EXP2].big,    pkey[TAG_EXP2].size, NULL);
	BIGNUM* bn_iqmp = BN_bin2bn((unsigned char*)pkey[TAG_COEFF].big,   pkey[TAG_COEFF].size, NULL);
	RSA_set0_factors(rsa, bn_p, bn_q);
	RSA_set0_crt_params(rsa, bn_dmp1, bn_dmq1, bn_iqmp);
	RSA_set0_key(rsa, bn_n, bn_e, bn_d);

	ossl_pkey = EVP_PKEY_new();

	// Convert RSA to EVP_PKEY
	if (!EVP_PKEY_set1_RSA(ossl_pkey, rsa))
	{
		fprintf(stderr, "ERROR: Could not convert RSA key to EVP_PKEY.\n");
		RSA_free(rsa);
		EVP_PKEY_free(ossl_pkey);
		return 1;
	}
	RSA_free(rsa);

	// Convert EVP_PKEY to PKCS#8
	if (!(p8inf = EVP_PKEY2PKCS8(ossl_pkey)))
	{
		fprintf(stderr, "ERROR: Could not convert EVP_PKEY to PKCS#8.\n");
		EVP_PKEY_free(ossl_pkey);
		return 1;
	}
	EVP_PKEY_free(ossl_pkey);

	// Open output file
	if (!(out = BIO_new_file (out_path, "wb")))
	{
		fprintf(stderr, "ERROR: Could not open the output file.\n");
		PKCS8_PRIV_KEY_INFO_free(p8inf);
		return 1;
	}

	// Write to disk
	if (file_pin == NULL)
	{
		PEM_write_bio_PKCS8_PRIV_KEY_INFO(out, p8inf);
		printf("The key has been written to %s\n", out_path);
	}
	else
	{
		// Encrypt p8
		if (!(p8 = PKCS8_encrypt(NID_pbeWithMD5AndDES_CBC, NULL,
					file_pin, strlen(file_pin), NULL, 
					0, PKCS12_DEFAULT_ITER, p8inf)))
		{
			fprintf(stderr, "ERROR: Could not encrypt the PKCS#8 file\n");
			result = 1;
		}
		else
		{
			PEM_write_bio_PKCS8(out, p8);
			X509_SIG_free(p8);
			printf("The key has been written to %s\n", out_path);
		}
	}

	PKCS8_PRIV_KEY_INFO_free(p8inf);
	BIO_free_all(out);

	return result;
}